

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                   (ulong state,ulong *first,ulong len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint64_t uVar9;
  ulong uVar10;
  
  if (len < 9) {
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar10 = (ulong)*(byte *)((long)first + (len >> 1)) << 8 |
               (ulong)*(byte *)((long)first + (len - 1)) | (ulong)(byte)*first << 0x10;
    }
    else {
      uVar10 = CONCAT44((int)*first,*(undefined4 *)((long)first + (len - 4)));
    }
    uVar10 = (uVar10 ^ state) * -0x234dd359734ecb13;
    uVar9 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18
            | (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 |
            (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
  }
  else {
    if (len < 0x11) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)((long)first + (len - 8)) ^ 0xdcb22ca68cb134ed;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = state ^ *first;
      auVar8 = auVar1 * auVar5;
    }
    else if (len < 0x21) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = first[1] ^ state;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *first ^ 0x13198a2e03707344;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = state ^ *(ulong *)((long)first + (len - 8));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)first + (len - 0x10)) ^ 0x82efa98ec4e6c89;
      auVar8._8_8_ = SUB168(auVar3 * auVar7,8) ^ SUB168(auVar2 * auVar6,8) ^
                     SUB168(auVar2 * auVar6,0);
      auVar8._0_8_ = SUB168(auVar3 * auVar7,0);
    }
    else {
      if (0x400 < len) {
        uVar9 = CombineLargeContiguousImpl64(state,(uchar *)first,len);
        return uVar9;
      }
      uVar9 = LowLevelHashImpl((uchar *)first,len);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar9 ^ state;
      auVar8 = auVar4 * ZEXT816(0xdcb22ca68cb134ed);
    }
    uVar9 = auVar8._8_8_ ^ auVar8._0_8_;
  }
  return uVar9;
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 8> /* sizeof_size_t */) {
  // For large values we use LowLevelHash or CityHash depending on the platform,
  // for small ones we just use a multiplicative hash.
  if (len <= 8) {
    return CombineSmallContiguousImpl(state, first, len);
  }
  if (len <= 16) {
    return CombineContiguousImpl9to16(state, first, len);
  }
  if (len <= 32) {
    return CombineContiguousImpl17to32(state, first, len);
  }
  if (ABSL_PREDICT_TRUE(len <= PiecewiseChunkSize())) {
    return Mix(state ^ Hash64(first, len), kMul);
  }
  return CombineLargeContiguousImpl64(state, first, len);
}